

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SuperFastHash.cpp
# Opt level: O3

uint32_t SuperFastHash(char *data,int len,int32_t hash)

{
  ushort *puVar1;
  ushort uVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  
  if (data == (char *)0x0 || len < 1) {
    return 0;
  }
  if (3 < (uint)len) {
    uVar5 = ((uint)len >> 2) + 1;
    do {
      uVar2 = *(ushort *)data;
      uVar5 = uVar5 - 1;
      puVar1 = (ushort *)((long)data + 2);
      data = (char *)((long)data + 4);
      uVar3 = ((uint)uVar2 + hash) * 0x10000 ^ (uint)*puVar1 << 0xb ^ (uint)uVar2 + hash;
      hash = ((int)uVar3 >> 0xb) + uVar3;
    } while (1 < uVar5);
  }
  switch(len & 3) {
  case 0:
    goto switchD_0016a25b_caseD_0;
  case 1:
    uVar5 = hash + (char)*(ushort *)data;
    uVar5 = uVar5 * 0x400 ^ uVar5;
    iVar4 = (int)uVar5 >> 1;
    break;
  case 2:
    uVar5 = (hash + (uint)*(ushort *)data) * 0x800 ^ hash + (uint)*(ushort *)data;
    iVar4 = (int)uVar5 >> 0x11;
    break;
  case 3:
    uVar5 = (hash + (uint)*(ushort *)data) * 0x10000 ^
            (int)(char)*(ushort *)((long)data + 2) << 0x12 ^ hash + (uint)*(ushort *)data;
    hash = ((int)uVar5 >> 0xb) + uVar5;
    goto switchD_0016a25b_caseD_0;
  }
  hash = iVar4 + uVar5;
switchD_0016a25b_caseD_0:
  uVar5 = hash * 8 ^ hash;
  uVar5 = ((int)uVar5 >> 5) + uVar5;
  uVar5 = uVar5 * 0x10 ^ uVar5;
  uVar5 = ((int)uVar5 >> 0x11) + uVar5;
  uVar5 = uVar5 * 0x2000000 ^ uVar5;
  return ((int)uVar5 >> 6) + uVar5;
}

Assistant:

uint32_t SuperFastHash (const char * data, int len, int32_t hash) {
  uint32_t tmp;
  int rem;

  if (len <= 0 || !data) return 0;

  rem = len & 3;
  len >>= 2;

  /* Main loop */
  for (;len > 0; len--) {
    hash  += get16bits (data);
    tmp    = (get16bits (data+2) << 11) ^ hash;
    hash   = (hash << 16) ^ tmp;
    data  += 2*sizeof (uint16_t);
    hash  += hash >> 11;
  }

  /* Handle end cases */
  switch (rem) {
    case 3:	hash += get16bits (data);
        hash ^= hash << 16;
        hash ^= data[sizeof (uint16_t)] << 18;
        hash += hash >> 11;
        break;
    case 2:	hash += get16bits (data);
        hash ^= hash << 11;
        hash += hash >> 17;
        break;
    case 1: hash += *data;
        hash ^= hash << 10;
        hash += hash >> 1;
  }

  /* Force "avalanching" of final 127 bits */
  hash ^= hash << 3;
  hash += hash >> 5;
  hash ^= hash << 4;
  hash += hash >> 17;
  hash ^= hash << 25;
  hash += hash >> 6;

  return hash;
}